

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcompleter.cpp
# Opt level: O0

int __thiscall QCompletionModel::rowCount(QCompletionModel *this,QModelIndex *parent)

{
  bool bVar1;
  int iVar2;
  QCompletionEngine *pQVar3;
  qsizetype qVar4;
  arrow_operator_result ppQVar5;
  long in_RDI;
  QCompletionModelPrivate *d;
  QCompletionModel *in_stack_ffffffffffffffc8;
  QCompletionEngine *in_stack_ffffffffffffffd0;
  QAbstractItemModel *pQVar6;
  int local_4;
  
  d_func((QCompletionModel *)0xa69b81);
  bVar1 = QModelIndex::isValid((QModelIndex *)in_stack_ffffffffffffffd0);
  if (bVar1) {
    local_4 = 0;
  }
  else if ((*(byte *)(in_RDI + 0x20) & 1) == 0) {
    local_4 = completionCount(in_stack_ffffffffffffffc8);
  }
  else {
    pQVar3 = QScopedPointer<QCompletionEngine,_QScopedPointerDeleter<QCompletionEngine>_>::
             operator->((QScopedPointer<QCompletionEngine,_QScopedPointerDeleter<QCompletionEngine>_>
                         *)(in_RDI + 0x18));
    qVar4 = QList<QString>::size(&pQVar3->curParts);
    if (qVar4 != 1) {
      QScopedPointer<QCompletionEngine,_QScopedPointerDeleter<QCompletionEngine>_>::operator->
                ((QScopedPointer<QCompletionEngine,_QScopedPointerDeleter<QCompletionEngine>_> *)
                 (in_RDI + 0x18));
      iVar2 = QCompletionEngine::matchCount(in_stack_ffffffffffffffd0);
      if (iVar2 == 0) {
        QScopedPointer<QCompletionEngine,_QScopedPointerDeleter<QCompletionEngine>_>::operator->
                  ((QScopedPointer<QCompletionEngine,_QScopedPointerDeleter<QCompletionEngine>_> *)
                   (in_RDI + 0x18));
        bVar1 = QModelIndex::isValid((QModelIndex *)in_stack_ffffffffffffffd0);
        if (!bVar1) {
          return 0;
        }
      }
    }
    ppQVar5 = QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
              ::operator->((QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
                            *)in_stack_ffffffffffffffd0);
    pQVar6 = *ppQVar5;
    pQVar3 = QScopedPointer<QCompletionEngine,_QScopedPointerDeleter<QCompletionEngine>_>::
             operator->((QScopedPointer<QCompletionEngine,_QScopedPointerDeleter<QCompletionEngine>_>
                         *)(in_RDI + 0x18));
    local_4 = (**(code **)(*(long *)pQVar6 + 0x78))(pQVar6,&pQVar3->curParent);
  }
  return local_4;
}

Assistant:

int QCompletionModel::rowCount(const QModelIndex &parent) const
{
    Q_D(const QCompletionModel);
    if (parent.isValid())
        return 0;

    if (showAll) {
        // Show all items below current parent, even if we have no valid matches
        if (engine->curParts.size() != 1  && !engine->matchCount()
            && !engine->curParent.isValid())
            return 0;
        return d->model->rowCount(engine->curParent);
    }

    return completionCount();
}